

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

int __thiscall
sznet::net::TcpClient::connect(TcpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  self *psVar1;
  SourceFile file;
  Logger local_1018;
  undefined1 local_48 [12];
  string local_38;
  
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_48,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_48._0_8_;
    file.m_size = local_48._8_4_;
    Logger::Logger(&local_1018,file,0x62);
    psVar1 = LogStream::operator<<(&local_1018.m_impl.m_stream,"TcpClient::connect[");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] - connecting to ");
    InetAddress::toIpPort_abi_cxx11_
              (&local_38,
               &((this->m_connector).
                 super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_serverAddr);
    LogStream::operator<<(psVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    Logger::~Logger(&local_1018);
  }
  this->m_connect = true;
  Connector::start((this->m_connector).
                   super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return extraout_EAX;
}

Assistant:

void TcpClient::connect()
{
	// FIXME: check state
	LOG_INFO << "TcpClient::connect[" << m_name << "] - connecting to "
			<< m_connector->serverAddress().toIpPort();
	m_connect = true;
	m_connector->start();
}